

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O1

ASTNode * ParseFunc(Scope *scope,Lexer *lexer)

{
  Token tok;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  ASTList *pAVar4;
  ASTNode *pAVar5;
  
  iVar1 = scope->nodeSpot;
  scope->nodeSpot = iVar1 + 1;
  if (iVar1 < scope->nodeLength) {
    pAVar5 = scope->nodes + iVar1;
  }
  else {
    pAVar5 = (ASTNode *)0x0;
  }
  pAVar5->type = FUNC;
  tok = GetNextToken(lexer);
  if (tok == IDENTIFIER) {
    sVar2 = strlen(lexer->currentTokenString);
    pcVar3 = (char *)Allocate((int)sVar2 + 1);
    (pAVar5->meta).funcExpr.name = pcVar3;
    strcpy(pcVar3,lexer->currentTokenString);
    pAVar4 = ParseParams(scope,lexer,false);
    (pAVar5->meta).funcExpr.params = pAVar4;
    iVar1 = ParseBody(scope,lexer);
    (pAVar5->meta).funcExpr.body = iVar1;
    return pAVar5;
  }
  pcVar3 = TokenToString(tok);
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n","IDENTIFIER",pcVar3,
         (ulong)(uint)(lexer->tracker).row,
         (ulong)(((lexer->tracker).col + (lexer->tracker).currentTokenPosition) - 1));
  exit(0);
}

Assistant:

ASTNode* ParseFunc(Scope* scope, Lexer* lexer){
	TRACK();
	ASTNode* func = GetNextNode(scope);
	SET_NODE_TYPE(func, FUNC);
	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, IDENTIFIER, lexer);
	DEBUG_PRINT_SYNTAX2("Func", lexer->currentTokenString);

	SET_FUNC_NAME(func, Allocate((sizeof(char) * strlen(lexer->currentTokenString)) + sizeof(char)));
	strcpy(GET_FUNC_NAME(func), lexer->currentTokenString);

	SET_FUNC_PARAMS(func, ParseParams(scope, lexer, true));
	SET_FUNC_BODY(func, ParseBody(scope, lexer));
	// SET_IS_STMT(func);
	return func;
}